

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinGlobalSourceState::Initialize
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  pointer this_00;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->global_stage)._M_i == INIT) {
    if ((sink->probe_spill).
        super_unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
        .super__Head_base<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_false>._M_head_impl !=
        (ProbeSpill *)0x0) {
      this_00 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
                ::operator->(&sink->probe_spill);
      JoinHashTable::ProbeSpill::Finalize(this_00);
    }
    LOCK();
    (this->global_stage)._M_i = PROBE;
    UNLOCK();
    TryPrepareNextStage(this,sink);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void HashJoinGlobalSourceState::Initialize(HashJoinGlobalSinkState &sink) {
	auto guard = Lock();
	if (global_stage != HashJoinSourceStage::INIT) {
		// Another thread initialized
		return;
	}

	// Finalize the probe spill
	if (sink.probe_spill) {
		sink.probe_spill->Finalize();
	}

	global_stage = HashJoinSourceStage::PROBE;
	TryPrepareNextStage(sink);
}